

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpLookup(void *p,void *va,void *vb)

{
  nodemetalookup *b;
  nodemetalookup *a;
  void *vb_local;
  void *va_local;
  void *p_local;
  
  if (*vb < *va) {
    p_local._4_4_ = 1;
  }
  else if (*va < *vb) {
    p_local._4_4_ = -1;
  }
  else if (((*(long *)((long)va + 8) == 0) || (*(long *)((long)vb + 8) == 0)) ||
          ((**(uint **)((long)va + 8) & 0xff) != 0x26)) {
    if (((*(long *)((long)vb + 8) == 0) || (*(long *)((long)vb + 8) == 0)) ||
       ((**(uint **)((long)vb + 8) & 0xff) != 0x26)) {
      if (va == p) {
        p_local._4_4_ = 1;
      }
      else if (vb == p) {
        p_local._4_4_ = -1;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static NOINLINE int CmpLookup(const void* p, const void* va, const void* vb)
{
    const nodemetalookup* a = va;
    const nodemetalookup* b = vb;
    // sort by Id
    if (a->Id > b->Id) return 1;
    if (a->Id < b->Id) return -1;
    // make sure META_PARAM_BIT is after META_MODE_DATA
    if (a->Meta && b->Meta && a->Meta->Meta == META_PARAM_BIT) return 1;
    if (b->Meta && b->Meta && b->Meta->Meta == META_PARAM_BIT) return -1;
    // make sure META_PARAM_EVENT's are added in the order as they are found
    if (a==p) return 1;
    if (b==p) return -1;
    return 0;
}